

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_stack.h
# Opt level: O0

void uo_stack_insert_arr(uo_stack *stack,int index,void **items,size_t count)

{
  ulong n;
  uint64_t uVar1;
  void **ppvVar2;
  int local_38;
  size_t stack_count;
  size_t count_local;
  void **items_local;
  int index_local;
  uo_stack *stack_local;
  
  local_38 = index;
  if (index < 0) {
    local_38 = (int)stack->count + index;
  }
  n = count + stack->count;
  if (stack->capacity < n) {
    ppvVar2 = stack->items;
    uVar1 = next_power_of_two(n);
    stack->capacity = uVar1;
    ppvVar2 = (void **)realloc(ppvVar2,uVar1 << 3);
    stack->items = ppvVar2;
  }
  memmove(stack->items + (long)local_38 + count,stack->items + local_38,
          (stack->count - (long)local_38) * 8);
  memcpy(stack->items + local_38,items,count << 3);
  stack->count = n;
  return;
}

Assistant:

static inline void uo_stack_insert_arr(
    uo_stack *stack,
    int index,
    void *const *items,
    size_t count)
{
    index = index >= 0 ? index : (stack->count + index);
    size_t stack_count = count + stack->count;

    if (stack_count > stack->capacity)
        stack->items = realloc(stack->items, sizeof *stack->items * (stack->capacity = next_power_of_two(stack_count)));

    memmove(stack->items + index + count, stack->items + index, sizeof *stack->items * (stack->count - index));
    memcpy(stack->items + index, items, sizeof *items * count);
    stack->count = stack_count;
}